

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stacktrace_x86_64-inl.h
# Opt level: O0

int google::GetStackTrace(void **result,int max_depth,int skip_count)

{
  void **local_38;
  trace_arg_t targ;
  int skip_count_local;
  int max_depth_local;
  void **result_local;
  
  if ((ready_to_run & 1) == 0) {
    result_local._4_4_ = 0;
  }
  else {
    targ.result._4_4_ = skip_count + 1;
    targ.max_depth = 0;
    local_38 = result;
    targ.result._0_4_ = max_depth;
    targ.count = targ.result._4_4_;
    targ._20_4_ = max_depth;
    _Unwind_Backtrace(GetOneFrame,&local_38);
    result_local._4_4_ = targ.max_depth;
  }
  return result_local._4_4_;
}

Assistant:

int GetStackTrace(void** result, int max_depth, int skip_count) {
  if (!ready_to_run)
    return 0;

  trace_arg_t targ;

  skip_count += 1;         // Do not include the "GetStackTrace" frame

  targ.result = result;
  targ.max_depth = max_depth;
  targ.skip_count = skip_count;
  targ.count = 0;

  _Unwind_Backtrace(GetOneFrame, &targ);

  return targ.count;
}